

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateNonNestedInitializationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  int iVar2;
  char *pcVar3;
  long *plVar4;
  FieldDescriptor *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  char *local_40;
  long local_38;
  char local_30 [32];
  
  iVar2 = 0;
  if (*(long *)((java *)this->descriptor_ + 0x60) == 0) {
    UnderscoresToCamelCaseCheckReserved_abi_cxx11_(&local_60,(java *)this->descriptor_,in_RDX);
    pFVar1 = this->descriptor_;
    if (pFVar1[0x42] == (FieldDescriptor)0x0) {
      plVar4 = (long *)(*(long *)(pFVar1 + 0x50) + 0x28);
    }
    else if (*(long *)(pFVar1 + 0x60) == 0) {
      plVar4 = (long *)(*(long *)(pFVar1 + 0x28) + 0x80);
    }
    else {
      plVar4 = (long *)(*(long *)(pFVar1 + 0x60) + 0x50);
    }
    local_40 = local_30;
    pcVar3 = FastInt32ToBufferLeft
                       ((int)((ulong)((long)pFVar1 - *plVar4) >> 3) * 0x286bca1b,local_30);
    local_38 = (long)pcVar3 - (long)local_30;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,local_40,local_40 + local_38);
    io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
              (printer,"$name$.internalInit(descriptor.getExtensions().get($index$));\n",
               (char (*) [5])0x3958cc,&local_60,(char (*) [6])0x3a8ffa,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    iVar2 = 0x15;
  }
  return iVar2;
}

Assistant:

int ImmutableExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  if (descriptor_->extension_scope() == NULL) {
    // Only applies to non-nested extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCaseCheckReserved(descriptor_), "index",
        StrCat(descriptor_->index()));
    bytecode_estimate += 21;
  }
  return bytecode_estimate;
}